

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::skip
          (SimpleParser<avro::parsing::DummyHandler> *this,Decoder *d)

{
  Kind KVar1;
  undefined8 uVar2;
  size_type sVar3;
  reference pvVar4;
  non_const_type puVar5;
  non_const_type pbVar6;
  unsigned_long uVar7;
  ostream *poVar8;
  char *pcVar9;
  Exception *this_00;
  long *in_RSI;
  SimpleParser<avro::parsing::DummyHandler> *in_RDI;
  ostringstream oss;
  ProductionPtr pp_1;
  ProductionPtr pp;
  RepeaterInfo *p_2;
  size_t n_2;
  Symbol *t_3;
  RepeaterInfo *p_1;
  Symbol *t_2;
  size_t n_1;
  RepeaterInfo *p;
  Symbol *t_1;
  size_t n;
  Symbol *t;
  size_t sz;
  string *in_stack_fffffffffffffcf8;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *in_stack_fffffffffffffd00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd10;
  ostringstream *this_01;
  ProductionPtr *in_stack_fffffffffffffd18;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_fffffffffffffd20;
  iterator *in_stack_fffffffffffffd28;
  allocator<char> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd68;
  ostringstream local_260 [376];
  SimpleParser<avro::parsing::DummyHandler> local_e8;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *local_88;
  reference local_80;
  unsigned_long local_78;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *local_70;
  reference local_68;
  unsigned_long local_60;
  reference local_58;
  undefined1 local_4d;
  size_type local_18;
  long *local_10;
  
  local_10 = in_RSI;
  local_18 = std::
             stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             ::size((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x298c3d);
  if (local_18 == 0) {
    local_4d = 1;
    uVar2 = __cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    Exception::Exception((Exception *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    local_4d = 0;
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
LAB_00298d32:
  sVar3 = std::
          stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
          ::size((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                  *)0x298d40);
  if (sVar3 < local_18) {
    return;
  }
  local_58 = std::
             stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                    *)0x298d5c);
  KVar1 = Symbol::kind(local_58);
  switch(KVar1) {
  case sNull:
    (**(code **)(*local_10 + 0x18))();
    break;
  case sBool:
    (**(code **)(*local_10 + 0x20))();
    break;
  case sInt:
    (**(code **)(*local_10 + 0x28))();
    break;
  case sLong:
    (**(code **)(*local_10 + 0x30))();
    break;
  case sFloat:
    (**(code **)(*local_10 + 0x38))();
    break;
  case sDouble:
    (**(code **)(*local_10 + 0x40))();
    break;
  case sString:
    (**(code **)(*local_10 + 0x50))();
    break;
  case sBytes:
    (**(code **)(*local_10 + 0x60))();
    break;
  case sArrayStart:
    std::
    stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)0x298e3e);
    local_60 = (**(code **)(*local_10 + 0x90))();
    pvVar4 = std::
             stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                    *)0x298e65);
    Symbol::kind(pvVar4);
    assertMatch(sTerminalLow,0x298e79);
    if (local_60 != 0) {
      local_68 = std::
                 stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                        *)0x298e97);
      local_70 = Symbol::
                 extrap<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                           ((Symbol *)0x298eac);
      uVar7 = local_60;
      puVar5 = boost::tuples::
               get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                         ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                           *)0x298ece);
      *puVar5 = uVar7;
      goto LAB_00298d32;
    }
    break;
  case sArrayEnd:
    break;
  case sMapStart:
    std::
    stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)0x298eee);
    local_78 = (**(code **)(*local_10 + 0xa8))();
    if (local_78 != 0) {
      pvVar4 = std::
               stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                      *)0x298f25);
      Symbol::kind(pvVar4);
      assertMatch(sTerminalLow,0x298f39);
      local_80 = std::
                 stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                        *)0x298f47);
      local_88 = Symbol::
                 extrap<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                           ((Symbol *)0x298f5c);
      uVar7 = local_78;
      puVar5 = boost::tuples::
               get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                         ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                           *)0x298f7e);
      *puVar5 = uVar7;
      goto LAB_00298d32;
    }
    break;
  case sMapEnd:
    break;
  case sFixed:
    std::
    stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)0x298f9e);
    local_e8.parsingStack.c.
    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node =
         (_Map_pointer)
         std::
         stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
         ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                *)0x298fac);
    Symbol::extra<unsigned_long>((Symbol *)0x298fce);
    Decoder::decodeFixed((Decoder *)in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffd10);
    break;
  case sEnum:
    std::
    stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)0x299003);
    (**(code **)(*local_10 + 0x78))();
    break;
  case sUnion:
    std::
    stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)0x299024);
    local_e8.parsingStack.c.
    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)(**(code **)(*local_10 + 0xb0))();
    selectBranch(in_RDI,in_stack_fffffffffffffd68);
    goto LAB_00298d32;
  default:
    this_01 = local_260;
    std::__cxx11::ostringstream::ostringstream(this_01);
    poVar8 = std::operator<<((ostream *)this_01,"Don\'t know how to skip ");
    KVar1 = Symbol::kind(local_58);
    pcVar9 = Symbol::toString(KVar1);
    std::operator<<(poVar8,pcVar9);
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    Exception::Exception(this_00,in_stack_fffffffffffffcf8);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case sRepeater:
    local_e8.parsingStack.c.
    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
    super__Deque_impl_data._M_start._M_last =
         (_Elt_pointer)
         Symbol::
         extrap<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                   ((Symbol *)0x299061);
    puVar5 = boost::tuples::
             get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                       ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                         *)0x299076);
    if (*puVar5 == 0) {
      pbVar6 = boost::tuples::
               get<1,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                         ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                           *)0x299089);
      if ((*pbVar6 & 1U) == 0) {
        uVar7 = (**(code **)(*local_10 + 0xa0))();
      }
      else {
        uVar7 = (**(code **)(*local_10 + 0x88))();
      }
      puVar5 = boost::tuples::
               get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                         ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                           *)0x2990d3);
      *puVar5 = uVar7;
    }
    puVar5 = boost::tuples::
             get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                       ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                         *)0x2990e8);
    if (*puVar5 != 0) {
      puVar5 = boost::tuples::
               get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                         ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                           *)0x2990fb);
      *puVar5 = *puVar5 - 1;
      boost::tuples::
      get<3,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                  *)0x299112);
      append(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      goto LAB_00298d32;
    }
    break;
  case sIndirect:
    in_stack_fffffffffffffd28 =
         (iterator *)
         ((long)&local_e8.parsingStack.c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data + 0x10);
    Symbol::
    extra<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
              ((Symbol *)in_stack_fffffffffffffcf8);
    std::
    stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)0x299151);
    append(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    ~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 *)0x29916f);
    goto LAB_00298d32;
  case sSymbolic:
    goto switchD_00298d96_caseD_18;
  }
  std::
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
         *)0x299394);
  goto LAB_00298d32;
switchD_00298d96_caseD_18:
  in_stack_fffffffffffffd20 = &local_e8;
  Symbol::
  extra<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
            ((Symbol *)in_stack_fffffffffffffcf8);
  boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
  shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
            (in_stack_fffffffffffffd00,
             (weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
              *)in_stack_fffffffffffffcf8);
  boost::weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
  ~weak_ptr((weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *
            )0x2991d5);
  std::
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
         *)0x2991e3);
  append(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
  ~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x299204);
  goto LAB_00298d32;
}

Assistant:

void skip(Decoder& d) {
        const size_t sz = parsingStack.size();
        if (sz == 0) {
            throw Exception("Nothing to skip!");
        }
        while (parsingStack.size() >= sz) {
            Symbol& t = parsingStack.top();
            switch (t.kind()) {
            case Symbol::sNull:
                d.decodeNull();
                break;
            case Symbol::sBool:
                d.decodeBool();
                break;
            case Symbol::sInt:
                d.decodeInt();
                break;
            case Symbol::sLong:
                d.decodeLong();
                break;
            case Symbol::sFloat:
                d.decodeFloat();
                break;
            case Symbol::sDouble:
                d.decodeDouble();
                break;
            case Symbol::sString:
                d.skipString();
                break;
            case Symbol::sBytes:
                d.skipBytes();
                break;
            case Symbol::sArrayStart:
                {
                    parsingStack.pop();
                    size_t n = d.skipArray();
                    assertMatch(Symbol::sRepeater, parsingStack.top().kind());
                    if (n == 0) {
                        break;
                    }
                    Symbol& t = parsingStack.top();
                    RepeaterInfo *p = t.extrap<RepeaterInfo>();
                    boost::tuples::get<0>(*p) = n;
                    continue;
                }
            case Symbol::sArrayEnd:
                break;
            case Symbol::sMapStart:
                {
                    parsingStack.pop();
                    size_t n = d.skipMap();
                    if (n == 0) {
                        break;
                    }
                    assertMatch(Symbol::sRepeater, parsingStack.top().kind());
                    Symbol& t = parsingStack.top();
                    RepeaterInfo *p = t.extrap<RepeaterInfo>();
                    boost::tuples::get<0>(*p) = n;
                    continue;
                }
            case Symbol::sMapEnd:
                break;
            case Symbol::sFixed:
                {
                    parsingStack.pop();
                    Symbol& t = parsingStack.top();
                    d.decodeFixed(t.extra<size_t>());
                }
                break;
            case Symbol::sEnum:
                parsingStack.pop();
                d.decodeEnum();
                break;
            case Symbol::sUnion:
                {
                    parsingStack.pop();
                    size_t n = d.decodeUnionIndex();
                    selectBranch(n);
                    continue;
                }
            case Symbol::sRepeater:
                {
                    RepeaterInfo *p = t.extrap<RepeaterInfo>();
                    if (boost::tuples::get<0>(*p) == 0) {
                        boost::tuples::get<0>(*p) =
                            boost::tuples::get<1>(*p) ? d.arrayNext() :
                                d.mapNext();
                    }
                    if (boost::tuples::get<0>(*p) != 0) {
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<3>(*p));
                        continue;
                    }
                }
                break;
            case Symbol::sIndirect:
                {
                    ProductionPtr pp =
                        t.extra<ProductionPtr>();
                    parsingStack.pop();
                    append(pp);
                }
                continue;
            case Symbol::sSymbolic:
                {
                    ProductionPtr pp(
                        t.extra<boost::weak_ptr<Production> >());
                    parsingStack.pop();
                    append(pp);
                }
                continue;
            default:
                {
                    std::ostringstream oss;
                    oss << "Don't know how to skip "
                        << Symbol::toString(t.kind());
                    throw Exception(oss.str());
                }
            }
            parsingStack.pop();
        }
    }